

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

int __thiscall MeshLib::List<MeshLib::Edge>::remove(List<MeshLib::Edge> *this,char *__filename)

{
  ListNode<MeshLib::Edge> *pLVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  ListNode<MeshLib::Edge> *pLVar2;
  
  pLVar1 = this->m_head;
  if (pLVar1 != (ListNode<MeshLib::Edge> *)__filename) {
    do {
      pLVar2 = pLVar1;
      pLVar1 = pLVar2->m_next;
    } while (pLVar1 != (ListNode<MeshLib::Edge> *)__filename);
    pLVar2->m_next = *(ListNode<MeshLib::Edge> **)(__filename + 8);
    this->m_size = this->m_size + -1;
    operator_delete(__filename);
    return extraout_EAX;
  }
  this->m_head = pLVar1->m_next;
  operator_delete(__filename);
  this->m_size = this->m_size + -1;
  return extraout_EAX_00;
}

Assistant:

void List<T>::remove( ListNode<T> * tn )
{

	if( tn == m_head )
	{
		m_head = m_head->next();
		delete tn;
		m_size --;
		return;
	}

	ListNode<T> * n;
	n = m_head;

	while( n->next() != tn )
	{
		n = n->next();
	}


	if( n != NULL )
	{
		n->next() = tn->next();
		m_size --;
		delete tn;
	}
}